

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::hugeint_t,long>
          (BaseAppender *this,Vector *col,hugeint_t input)

{
  bool bVar1;
  InvalidInputException *this_00;
  int64_t iVar2;
  hugeint_t input_00;
  long result;
  int64_t local_50;
  string local_48;
  
  iVar2 = 0;
  bVar1 = TryCast::Operation<duckdb::hugeint_t,long>(input,&local_50,false);
  if (bVar1) {
    *(int64_t *)(col->data + (this->chunk).count * 8) = local_50;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.upper = iVar2;
  input_00.lower = input.upper;
  CastExceptionText<duckdb::hugeint_t,long>(&local_48,(duckdb *)input.lower,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_48);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}